

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.h
# Opt level: O2

void __thiscall
icu_63::number::impl::ParsedSubpatternInfo::ParsedSubpatternInfo(ParsedSubpatternInfo *this)

{
  this->groupingSizes = 0xffffffff0000;
  this->widthExceptAffixes = 0;
  this->hasPadding = false;
  this->paddingLocation = UNUM_PAD_BEFORE_PREFIX;
  this->integerLeadingHashSigns = 0;
  this->integerTrailingHashSigns = 0;
  this->integerNumerals = 0;
  this->integerAtSigns = 0;
  this->integerTotal = 0;
  this->fractionNumerals = 0;
  this->fractionHashSigns = 0;
  this->fractionTotal = 0;
  this->hasDecimal = false;
  DecimalQuantity::DecimalQuantity(&this->rounding);
  this->exponentHasPlusSign = false;
  this->hasPlusSign = false;
  this->exponentZeros = 0;
  this->hasPercentSign = false;
  this->hasPerMilleSign = false;
  this->hasCurrencySign = false;
  this->hasMinusSign = false;
  (this->prefixEndpoints).start = 0;
  (this->prefixEndpoints).end = 0;
  (this->suffixEndpoints).start = 0;
  (this->suffixEndpoints).end = 0;
  (this->paddingEndpoints).start = 0;
  (this->paddingEndpoints).end = 0;
  return;
}

Assistant:

struct U_I18N_API ParsedSubpatternInfo {
    uint64_t groupingSizes = 0x0000ffffffff0000L;
    int32_t integerLeadingHashSigns = 0;
    int32_t integerTrailingHashSigns = 0;
    int32_t integerNumerals = 0;
    int32_t integerAtSigns = 0;
    int32_t integerTotal = 0; // for convenience
    int32_t fractionNumerals = 0;
    int32_t fractionHashSigns = 0;
    int32_t fractionTotal = 0; // for convenience
    bool hasDecimal = false;
    int32_t widthExceptAffixes = 0;
    // Note: NullableValue causes issues here with std::move.
    bool hasPadding = false;
    UNumberFormatPadPosition paddingLocation = UNUM_PAD_BEFORE_PREFIX;
    DecimalQuantity rounding;
    bool exponentHasPlusSign = false;
    int32_t exponentZeros = 0;
    bool hasPercentSign = false;
    bool hasPerMilleSign = false;
    bool hasCurrencySign = false;
    bool hasMinusSign = false;
    bool hasPlusSign = false;

    Endpoints prefixEndpoints;
    Endpoints suffixEndpoints;
    Endpoints paddingEndpoints;
}